

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

bool __thiscall
google::protobuf::internal::EpsCopyInputStream::ParseEndsInSlopRegion<true>
          (EpsCopyInputStream *this,char *begin,int overrun,int depth)

{
  bool bVar1;
  Nonnull<const_char_*> pcVar2;
  int iVar3;
  
  iVar3 = (int)begin;
  if (iVar3 < 0) {
    pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       ((long)iVar3,0,"overrun >= 0");
  }
  else {
    pcVar2 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar2 == (Nonnull<const_char_*>)0x0) {
    if (iVar3 < 0x11) {
      pcVar2 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         ((ulong)begin & 0xffffffff,0x10,"overrun <= kSlopBytes");
    }
    if (pcVar2 == (Nonnull<const_char_*>)0x0) {
      bVar1 = anon_unknown_0::ParsingEndsInBuffer
                        ((anon_unknown_0 *)(this->patch_buffer_ + (long)iVar3 + -0x28),
                         (char *)&this->next_chunk_,(char *)(ulong)(uint)overrun,depth);
      return bVar1;
    }
  }
  else {
    ParseEndsInSlopRegion<true>();
  }
  ParseEndsInSlopRegion<true>();
}

Assistant:

bool EpsCopyInputStream::ParseEndsInSlopRegion(const char* begin, int overrun,
                                               int depth) {
  constexpr int kSlopBytes = EpsCopyInputStream::kSlopBytes;
  ABSL_DCHECK_GE(overrun, 0);
  ABSL_DCHECK_LE(overrun, kSlopBytes);
  auto ptr = begin + overrun;
  auto end = begin + kSlopBytes;
  return ParsingEndsInBuffer(ptr, end, depth);
}